

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  IMAP *pIVar1;
  
  pIVar1 = (data->req).p.imap;
  if (pIVar1 == (IMAP *)0x0) {
    status = CURLE_OK;
  }
  else {
    if (status != CURLE_OK) {
      Curl_conncontrol(data->conn,1);
    }
    (*Curl_cfree)(pIVar1->mailbox);
    pIVar1->mailbox = (char *)0x0;
    (*Curl_cfree)(pIVar1->uidvalidity);
    pIVar1->uidvalidity = (char *)0x0;
    pIVar1->transfer = PPTRANSFER_BODY;
  }
  return status;
}

Assistant:

static CURLcode pop3_done(struct Curl_easy *data, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct POP3 *pop3 = data->req.p.pop3;

  (void)premature;

  if(!pop3)
    return CURLE_OK;

  if(status) {
    connclose(data->conn, "POP3 done with bad status");
    result = status;         /* use the already set error code */
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(pop3->id);
  Curl_safefree(pop3->custom);

  /* Clear the transfer mode for the next request */
  pop3->transfer = PPTRANSFER_BODY;

  return result;
}